

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpClass(void *p,void *va,void *vb)

{
  fourcc_t BClass;
  fourcc_t AClass;
  nodeclass **b;
  nodeclass **a;
  void *vb_local;
  void *va_local;
  void *p_local;
  
  if (*(uint *)(*vb + 0x50) < *(uint *)(*va + 0x50)) {
    p_local._4_4_ = 1;
  }
  else if (*(uint *)(*va + 0x50) < *(uint *)(*vb + 0x50)) {
    p_local._4_4_ = -1;
  }
  else if (*(long *)(*va + 0x10) == *(long *)(*vb + 0x10)) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = -1;
    if (*(ulong *)(*vb + 0x10) < *(ulong *)(*va + 0x10)) {
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

static NOINLINE int CmpClass(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    fourcc_t AClass = NodeClass_ClassId(*a);
    fourcc_t BClass = NodeClass_ClassId(*b);
    if (AClass > BClass) return 1;
    if (AClass < BClass) return -1;
    if ((*a)->Module != (*b)->Module)
        return ((*a)->Module > (*b)->Module) ? 1:-1;
    return 0;
}